

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O1

bool __thiscall squall::KlassTable::find_klass_object<Foo_const>(KlassTable *this,HSQOBJECT *obj)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SQObjectType SVar3;
  _Hash_node_base *p_Var4;
  __hash_code __code;
  ulong uVar5;
  SQTable *extraout_RDX;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  
  p_Var4 = (_Hash_node_base *)
           std::type_info::hash_code((type_info *)&detail::KlassImp<Foo>::typeinfo);
  uVar1 = (this->klasses_)._M_h._M_bucket_count;
  uVar5 = (ulong)p_Var4 % uVar1;
  p_Var6 = (this->klasses_)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, p_Var4 != p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, p_Var4 == p_Var2[1]._M_nxt)) goto LAB_001084fd;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_001084fd:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var7->_M_nxt;
  }
  if (p_Var4 != (_Hash_node_base *)0x0) {
    p_Var2 = p_Var4[2]._M_nxt;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[3]._M_nxt;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    (*(code *)p_Var2->_M_nxt[2]._M_nxt)(p_Var2);
    SVar3 = (*(code *)p_Var2->_M_nxt[3]._M_nxt)(p_Var2);
    obj->_type = SVar3;
    (obj->_unVal).pTable = extraout_RDX;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return p_Var4 != (_Hash_node_base *)0x0;
}

Assistant:

bool find_klass_object(HSQOBJECT& obj) {
        typedef typename std::remove_cv<C>::type CC;
        size_t h = detail::KlassImp<CC>::hash();
        auto i = klasses_.find(h);
        if (i == klasses_.end()) {
            return false;
        } else {
            auto p = (*i).second;
            p->close();
            obj = p->get_klass_object();
            return true;
        }
    }